

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::WFXMLScanner::scanNext(WFXMLScanner *this,XMLPScanToken *token)

{
  undefined1 uVar1;
  bool bVar2;
  RuntimeException *this_00;
  XMLCh *text1;
  XMLSize_t XVar3;
  Codes anon_var_0;
  Codes anon_var_0_1;
  OutOfMemoryException *anon_var_0_3;
  XMLException *excToCatch;
  OutOfMemoryException *anon_var_0_2;
  StackElem *pSStack_70;
  bool gotData;
  StackElem *topElem;
  EndOfEntityException *toCatch;
  undefined8 local_58;
  undefined1 local_50 [8];
  ReaderMgrResetType resetReaderMgr;
  bool retVal;
  XMLSize_t XStack_30;
  XMLTokens curToken;
  XMLSize_t orgReader;
  XMLPScanToken *local_18;
  XMLPScanToken *token_local;
  WFXMLScanner *this_local;
  
  local_18 = token;
  token_local = (XMLPScanToken *)this;
  bVar2 = XMLScanner::isLegalToken(&this->super_XMLScanner,token);
  if (bVar2) {
    resetReaderMgr._19_1_ = 1;
    toCatch = (EndOfEntityException *)ReaderMgr::reset;
    local_58 = 0;
    JanitorMemFunCall<xercesc_4_0::ReaderMgr>::JanitorMemFunCall
              ((JanitorMemFunCall<xercesc_4_0::ReaderMgr> *)local_50,
               &(this->super_XMLScanner).fReaderMgr,(MFPT)ReaderMgr::reset);
    resetReaderMgr._20_4_ =
         XMLScanner::senseNextToken(&this->super_XMLScanner,&stack0xffffffffffffffd0);
    if (resetReaderMgr._20_4_ == Token_CharData) {
      (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xc])
                (this,&(this->super_XMLScanner).fCDataBuf);
    }
    else if (resetReaderMgr._20_4_ == Token_EOF) {
      bVar2 = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
      if (!bVar2) {
        pSStack_70 = ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
        text1 = XMLElementDecl::getFullName(pSStack_70->fThisElement);
        XMLScanner::emitError
                  (&this->super_XMLScanner,EndedWithTagsOnStack,text1,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      resetReaderMgr._19_1_ = 0;
    }
    else {
      anon_var_0_2._7_1_ = 1;
      switch(resetReaderMgr._20_4_) {
      case (BADTYPE)0x0:
        bVar2 = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
        if (bVar2) {
          XMLScanner::emitError(&this->super_XMLScanner,CDATAOutsideOfContent);
        }
        (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xb])();
        break;
      default:
        ReaderMgr::skipToChar(&(this->super_XMLScanner).fReaderMgr,L'<');
        break;
      case (BADTYPE)0x2:
        XMLScanner::scanComment(&this->super_XMLScanner);
        break;
      case (BADTYPE)0x3:
        scanEndTag(this,(bool *)((long)&anon_var_0_2 + 7));
        break;
      case (BADTYPE)0x5:
        XMLScanner::scanPI(&this->super_XMLScanner);
        break;
      case (BADTYPE)0x6:
        if (((this->super_XMLScanner).fDoNamespaces & 1U) == 0) {
          scanStartTag(this,(bool *)((long)&anon_var_0_2 + 7));
        }
        else {
          scanStartTagNS(this,(bool *)((long)&anon_var_0_2 + 7));
        }
      }
      XVar3 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
      if (XStack_30 != XVar3) {
        XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
      }
      if (((anon_var_0_2._7_1_ & 1) == 0) &&
         (XMLScanner::scanMiscellaneous(&this->super_XMLScanner),
         (this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0)) {
        (*((this->super_XMLScanner).fDocHandler)->_vptr_XMLDocumentHandler[5])();
      }
    }
    if ((resetReaderMgr._19_1_ & 1) != 0) {
      JanitorMemFunCall<xercesc_4_0::ReaderMgr>::release
                ((JanitorMemFunCall<xercesc_4_0::ReaderMgr> *)local_50);
    }
    uVar1 = resetReaderMgr._19_1_;
    JanitorMemFunCall<xercesc_4_0::ReaderMgr>::~JanitorMemFunCall
              ((JanitorMemFunCall<xercesc_4_0::ReaderMgr> *)local_50);
    return (bool)(uVar1 & 1);
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/WFXMLScanner.cpp"
             ,0xf6,Scan_BadPScanToken,(this->super_XMLScanner).fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
}

Assistant:

bool WFXMLScanner::scanNext(XMLPScanToken& token)
{
    // Make sure this token is still legal
    if (!isLegalToken(token))
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_BadPScanToken, fMemoryManager);

    // Find the next token and remember the reader id
    XMLSize_t orgReader;
    XMLTokens curToken;
    bool retVal = true;

    ReaderMgrResetType  resetReaderMgr(&fReaderMgr, &ReaderMgr::reset);

    try
    {
        while (true)
        {
            //  We have to handle any end of entity exceptions that happen here.
            //  We could be at the end of X nested entities, each of which will
            //  generate an end of entity exception as we try to move forward.
            try
            {
                curToken = senseNextToken(orgReader);
                break;
            }
            catch(const EndOfEntityException& toCatch)
            {
                // Send an end of entity reference event
                if (fDocHandler)
                    fDocHandler->endEntityReference(toCatch.getEntity());
            }
        }

        if (curToken == Token_CharData)
        {
            scanCharData(fCDataBuf);
        }
        else if (curToken == Token_EOF)
        {
            if (!fElemStack.isEmpty())
            {
                const ElemStack::StackElem* topElem = fElemStack.popTop();
                emitError
                (
                    XMLErrs::EndedWithTagsOnStack
                    , topElem->fThisElement->getFullName()
                );
            }

            retVal = false;
        }
        else
        {
            // Its some sort of markup
            bool gotData = true;
            switch(curToken)
            {
                case Token_CData :
                    // Make sure we are within content
                    if (fElemStack.isEmpty())
                        emitError(XMLErrs::CDATAOutsideOfContent);
                    scanCDSection();
                    break;

                case Token_Comment :
                    scanComment();
                    break;

                case Token_EndTag :
                    scanEndTag(gotData);
                    break;

                case Token_PI :
                    scanPI();
                    break;

                case Token_StartTag :
                    if (fDoNamespaces)
                        scanStartTagNS(gotData);
                    else
                        scanStartTag(gotData);
                    break;

                default :
                    fReaderMgr.skipToChar(chOpenAngle);
                    break;
            }

            if (orgReader != fReaderMgr.getCurrentReaderNum())
                emitError(XMLErrs::PartialMarkupInEntity);

            // If we hit the end, then do the miscellaneous part
            if (!gotData)
            {
                // That went ok, so scan for any miscellaneous stuff
                scanMiscellaneous();

                if (fDocHandler)
                    fDocHandler->endDocument();
            }
        }
    }
    //  NOTE:
    //
    //  In all of the error processing below, the emitError() call MUST come
    //  before the flush of the reader mgr, or it will fail because it tries
    //  to find out the position in the XML source of the error.
    catch(const XMLErrs::Codes)
    {
        // This is a 'first failure' exception, so return failure
        retVal = false;
    }
    catch(const XMLValid::Codes)
    {
        // This is a 'first fatal error' type exit, so return failure
        retVal = false;
    }
    catch(const XMLException& excToCatch)
    {
        //  Emit the error and catch any user exception thrown from here. Make
        //  sure in all cases we flush the reader manager.
        fInException = true;
        try
        {
            if (excToCatch.getErrorType() == XMLErrorReporter::ErrType_Warning)
                emitError
                (
                    XMLErrs::XMLException_Warning
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else if (excToCatch.getErrorType() >= XMLErrorReporter::ErrType_Fatal)
                emitError
                (
                    XMLErrs::XMLException_Fatal
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
            else
                emitError
                (
                    XMLErrs::XMLException_Error
                    , excToCatch.getCode()
                    , excToCatch.getMessage()
                );
        }
        catch(const OutOfMemoryException&)
        {
            // This is a special case for out-of-memory
            // conditions, because resetting the ReaderMgr
            // can be problematic.
            resetReaderMgr.release();

            throw;
        }

        // Return failure
        retVal = false;
    }
    catch(const OutOfMemoryException&)
    {
        throw;
    }

    // If we are not at the end, release the object that will
    // reset the ReaderMgr.
    if (retVal)
        resetReaderMgr.release();

    return retVal;
}